

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int binomial_cdf_inv(double cdf,int a,double b)

{
  double dVar1;
  int local_40;
  int x2;
  int x;
  double pdf;
  double cdf2;
  double b_local;
  int a_local;
  double cdf_local;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    pdf = 0.0;
    local_40 = 0;
    while( true ) {
      if (a < local_40) {
        return 0;
      }
      dVar1 = binomial_pdf(local_40,a,b);
      pdf = pdf + dVar1;
      if (cdf <= pdf) break;
      local_40 = local_40 + 1;
    }
    return local_40;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"BINOMIAL_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int binomial_cdf_inv ( double cdf, int a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BINOMIAL_CDF_INV inverts the Binomial CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, int A, the number of trials.
//    1 <= A.
//
//    Input, double B, the probability of success on one trial.
//    0.0 <= B <= 1.0.
//
//    Output, int BINOMIAL_CDF_INV, the corresponding argument.
//
{
  double cdf2;
  double pdf;
  int x;
  int x2;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "BINOMIAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  x = 0.0;
  cdf2 = 0.0;

  for ( x2 = 0; x2 <= a; x2++ )
  {
    pdf = binomial_pdf ( x2, a, b );

    cdf2 = cdf2 + pdf;

    if ( cdf <= cdf2 )
    {
      x = x2;
      return x;
    }

  }

  return x;
}